

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  XML_Convert_Result XVar7;
  int iVar8;
  ulong uVar9;
  char **ppcVar10;
  long lVar11;
  unsigned_short **ppuVar12;
  char **ppcVar13;
  uint uVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar16;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  int iVar17;
  unsigned_short *in_R8;
  char *pcVar18;
  uint uVar15;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar16 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    ppcVar13 = (char **)(ptr + 1);
    ppcVar10 = (char **)(end + -(long)ppcVar13);
    if ((long)ppcVar10 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13)) {
    case 5:
      if (ppcVar10 == (char **)0x1) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[0])
                        (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                         ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,extraout_RDX_12,ppcVar10);
      lVar11 = 2;
      break;
    case 6:
      if (ppcVar10 < (char **)0x3) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[1])
                        (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                         ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[2])(enc,(char *)ppcVar13,extraout_RDX_11,ppcVar10);
      lVar11 = 3;
      break;
    case 7:
      if (ppcVar10 < (char **)0x4) {
        return -2;
      }
      iVar6 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                         (char *)ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[3])(enc,(char *)ppcVar13,extraout_RDX_10,ppcVar10);
      lVar11 = 4;
      break;
    default:
      goto switchD_00177ae5_caseD_8;
    case 0xf:
      iVar6 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar6;
    case 0x10:
      pbVar1 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
        return -1;
      }
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar1);
      if (cVar3 != '\x14') {
        if (cVar3 != '\x1b') {
          *nextTokPtr = (char *)pbVar1;
          return 0;
        }
        iVar6 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar6;
      }
      pcVar16 = ptr + 3;
      if ((long)end - (long)pcVar16 < 6) {
        return -1;
      }
      pcVar18 = ptr + 9;
      lVar11 = 0;
      do {
        if (pcVar16[lVar11] != (&big2_scanCdataSection_CDATA_LSQB)[lVar11]) {
          pcVar18 = pcVar16 + lVar11;
          iVar6 = 0;
          goto LAB_0017823c;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      iVar6 = 8;
LAB_0017823c:
      *nextTokPtr = pcVar18;
      return iVar6;
    case 0x11:
      ppcVar13 = (char **)(ptr + 2);
      ppcVar10 = (char **)(end + -(long)ppcVar13);
      if ((long)ppcVar10 < 1) {
        return -1;
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      iVar6 = 0;
      iVar17 = 0;
      if (bVar2 < 7) {
        if (bVar2 == 5) {
          if (ppcVar10 == (char **)0x1) {
            return -2;
          }
          iVar8 = (*enc[3].literalScanners[0])
                            (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                             ppcVar10);
          iVar6 = iVar17;
          if (iVar8 != 0) goto switchD_00178139_caseD_8;
          iVar8 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,extraout_RDX_15,ppcVar10);
          lVar11 = 2;
        }
        else {
          iVar6 = iVar17;
          if (bVar2 != 6) goto switchD_00178139_caseD_8;
          if (ppcVar10 < (char **)0x3) {
            return -2;
          }
          iVar8 = (*enc[3].literalScanners[1])
                            (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                             ppcVar10);
          if (iVar8 != 0) goto switchD_00178139_caseD_8;
          iVar8 = (*enc[3].scanners[2])(enc,(char *)ppcVar13,extraout_RDX_13,ppcVar10);
          lVar11 = 3;
        }
LAB_001780f1:
        iVar6 = iVar17;
        if (iVar8 == 0) goto switchD_00178139_caseD_8;
      }
      else {
        if (bVar2 == 7) {
          if (ppcVar10 < (char **)0x4) {
            return -2;
          }
          iVar8 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)ppcVar13,(char *)&switchD_00177ae5::switchdataD_001bac44,
                             (char *)ppcVar10);
          iVar6 = iVar17;
          if (iVar8 != 0) goto switchD_00178139_caseD_8;
          iVar8 = (*enc[3].scanners[3])(enc,(char *)ppcVar13,extraout_RDX_14,ppcVar10);
          lVar11 = 4;
          goto LAB_001780f1;
        }
        lVar11 = 1;
        if ((bVar2 != 0x16) && (bVar2 != 0x18)) goto switchD_00178139_caseD_8;
      }
      ppcVar13 = (char **)((long)ppcVar13 + lVar11);
joined_r0x00178105:
      uVar9 = (long)end - (long)ppcVar13;
      if ((long)uVar9 < 1) {
        return -1;
      }
      uVar15 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      uVar14 = uVar15 - 5;
      iVar6 = iVar17;
      if (0x16 < uVar14) goto switchD_00178139_caseD_8;
      ppuVar12 = (unsigned_short **)0x1;
      pcVar16 = (char *)((long)&switchD_00178139::switchdataD_001bac94 +
                        (long)(int)(&switchD_00178139::switchdataD_001bac94)[uVar14]);
      switch(uVar15) {
      case 5:
        if (uVar9 == 1) {
          return -2;
        }
        iVar8 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar13,pcVar16,(char **)0x1);
        if (iVar8 != 0) goto switchD_00178139_caseD_8;
        XVar7 = (*enc[2].utf16Convert)(enc,ppcVar13,extraout_RDX_16,ppuVar12,in_R8);
        ppuVar12 = (unsigned_short **)0x2;
        break;
      case 6:
        if (uVar9 < 3) {
          return -2;
        }
        iVar8 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar13,pcVar16,(char **)0x1);
        if (iVar8 != 0) goto switchD_00178139_caseD_8;
        XVar7 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
        ppuVar12 = (unsigned_short **)0x3;
        break;
      case 7:
        if (uVar9 < 4) {
          return -2;
        }
        iVar8 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar13,pcVar16,(char *)0x1);
        if (iVar8 != 0) goto switchD_00178139_caseD_8;
        XVar7 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,extraout_RDX_17,(char **)ppuVar12);
        ppuVar12 = (unsigned_short **)0x4;
        break;
      default:
        goto switchD_00178139_caseD_8;
      case 9:
      case 10:
      case 0x15:
        ppcVar13 = (char **)((long)ppcVar13 + 1);
        lVar11 = (long)end - (long)ppcVar13;
        while( true ) {
          if (lVar11 < 1) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
          if ((1 < bVar2 - 9) && (bVar2 != 0x15)) break;
          ppcVar13 = (char **)((long)ppcVar13 + 1);
          lVar11 = lVar11 + -1;
        }
        if (bVar2 != 0xb) goto switchD_00178139_caseD_8;
switchD_00178139_caseD_b:
        ppcVar13 = (char **)((long)ppcVar13 + 1);
        iVar6 = 5;
switchD_00178139_caseD_8:
        *nextTokPtr = (char *)ppcVar13;
        return iVar6;
      case 0xb:
        goto switchD_00178139_caseD_b;
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00178139_caseD_16;
      }
      if (XVar7 == XML_CONVERT_COMPLETED) goto switchD_00178139_caseD_8;
switchD_00178139_caseD_16:
      ppcVar13 = (char **)((long)ppcVar13 + (long)ppuVar12);
      goto joined_r0x00178105;
    case 0x16:
    case 0x18:
      lVar11 = 1;
      goto LAB_00177aec;
    }
    if (iVar6 == 0) {
switchD_00177ae5_caseD_8:
      *nextTokPtr = (char *)ppcVar13;
      return 0;
    }
LAB_00177aec:
    ppcVar13 = (char **)((long)ppcVar13 + lVar11);
    uVar9 = (long)end - (long)ppcVar13;
    if ((long)uVar9 < 1) {
      return -1;
    }
    bVar4 = false;
LAB_00177b0d:
    uVar15 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
    uVar14 = uVar15 - 5;
    if (0x18 < uVar14) goto switchD_00177ae5_caseD_8;
    ppuVar12 = (unsigned_short **)0x1;
    pcVar16 = (char *)((long)&switchD_00177b34::switchdataD_001bacf0 +
                      (long)(int)(&switchD_00177b34::switchdataD_001bacf0)[uVar14]);
    switch(uVar15) {
    case 5:
      if (uVar9 == 1) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar13,pcVar16,(char **)0x1);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      XVar7 = (*enc[2].utf16Convert)(enc,ppcVar13,extraout_RDX_02,ppuVar12,in_R8);
      ppuVar12 = (unsigned_short **)0x2;
      break;
    case 6:
      if (uVar9 < 3) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar13,pcVar16,(char **)0x1);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      XVar7 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
      ppuVar12 = (unsigned_short **)0x3;
      break;
    case 7:
      if (uVar9 < 4) {
        return -2;
      }
      iVar6 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar13,pcVar16,(char *)0x1);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      XVar7 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,extraout_RDX_04,(char **)ppuVar12);
      ppuVar12 = (unsigned_short **)0x4;
      break;
    default:
      goto switchD_00177ae5_caseD_8;
    case 9:
    case 10:
    case 0x15:
      ppcVar13 = (char **)((long)ppcVar13 + 1);
      ppcVar10 = (char **)(end + -(long)ppcVar13);
      if ((long)ppcVar10 < 1) {
        return -1;
      }
      goto LAB_00178050;
    case 0xb:
      goto switchD_00177b34_caseD_b;
    case 0x11:
      goto switchD_00177b34_caseD_11;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_00177b34_caseD_16;
    case 0x17:
      if (bVar4) goto switchD_00177ae5_caseD_8;
      ptr = (char *)((long)ppcVar13 + 1);
      uVar9 = (long)end - (long)ptr;
      if ((long)uVar9 < 1) {
        return -1;
      }
      ppcVar10 = (char **)(ulong)(byte)*ptr;
      bVar2 = *(byte *)((long)enc[1].scanners + (long)ppcVar10);
      pcVar16 = (char *)(ulong)bVar2;
      if (bVar2 < 0x16) {
        if (bVar2 == 5) {
          if (uVar9 == 1) {
            return -2;
          }
          iVar6 = (*enc[3].literalScanners[0])(enc,ptr,pcVar16,ppcVar10);
          if (iVar6 != 0) goto switchD_0017795f_caseD_0;
          iVar6 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_05,ppcVar10);
          ppuVar12 = (unsigned_short **)0x3;
        }
        else if (bVar2 == 6) {
          if (uVar9 < 3) {
            return -2;
          }
          iVar6 = (*enc[3].literalScanners[1])(enc,ptr,pcVar16,ppcVar10);
          if (iVar6 != 0) goto switchD_0017795f_caseD_0;
          iVar6 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_06,ppcVar10);
          ppuVar12 = (unsigned_short **)0x4;
        }
        else {
          if (bVar2 != 7) goto switchD_0017795f_caseD_0;
          if (uVar9 < 4) {
            return -2;
          }
          iVar6 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar16,(char *)ppcVar10);
          if (iVar6 != 0) goto switchD_0017795f_caseD_0;
          iVar6 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_03,ppcVar10);
          ppuVar12 = (unsigned_short **)0x5;
        }
        bVar4 = true;
        if (iVar6 != 0) goto switchD_00177b34_caseD_16;
        goto switchD_0017795f_caseD_0;
      }
      bVar4 = true;
      ppuVar12 = (unsigned_short **)0x2;
      if ((bVar2 != 0x16) && (bVar2 != 0x18)) goto switchD_0017795f_caseD_0;
      goto switchD_00177b34_caseD_16;
    }
    if (XVar7 == XML_CONVERT_COMPLETED) goto switchD_00177ae5_caseD_8;
switchD_00177b34_caseD_16:
    ppcVar13 = (char **)((long)ppcVar13 + (long)ppuVar12);
    uVar9 = (long)end - (long)ppcVar13;
    if ((long)uVar9 < 1) {
      return -1;
    }
    goto LAB_00177b0d;
  case 3:
    iVar6 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar6;
  case 4:
    pbVar1 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
      return -5;
    }
    if (*pbVar1 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x00177d2c;
  case 5:
    if ((long)(end + -(long)ptr) < 2) {
      return -2;
    }
    iVar6 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)(end + -(long)ptr));
    if (iVar6 == 0) {
      pcVar16 = extraout_RDX_00;
      pbVar1 = (byte *)(ptr + 2);
      goto joined_r0x00177d2c;
    }
    break;
  case 6:
    if ((long)(end + -(long)ptr) < 3) {
      return -2;
    }
    iVar6 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)(end + -(long)ptr));
    if (iVar6 == 0) {
      pcVar16 = extraout_RDX;
      pbVar1 = (byte *)(ptr + 3);
      goto joined_r0x00177d2c;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar6 = (*enc[3].nameMatchesAscii)(enc,ptr,end,end + -(long)ptr);
    if (iVar6 == 0) {
      pcVar16 = extraout_RDX_01;
      pbVar1 = (byte *)(ptr + 4);
      goto joined_r0x00177d2c;
    }
    break;
  case 9:
    pcVar16 = ptr + 1;
    if (end != pcVar16 && -1 < (long)end - (long)pcVar16) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar16 = ptr + 2;
      }
      *nextTokPtr = pcVar16;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar1 = (byte *)(ptr + 1);
joined_r0x00177d2c:
    while( true ) {
      pbVar5 = pbVar1;
      uVar9 = (long)end - (long)pbVar5;
      if ((long)uVar9 < 1) {
        *nextTokPtr = (char *)pbVar5;
        return 6;
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      if ((ulong)bVar2 < 0xb) break;
      pbVar1 = pbVar5 + 1;
    }
    ppcVar13 = (char **)((long)&switchD_00177d58::switchdataD_001badb8 +
                        (long)(int)(&switchD_00177d58::switchdataD_001badb8)[bVar2]);
    switch(bVar2) {
    case 4:
      if (uVar9 == 1) break;
      pbVar1 = pbVar5 + 1;
      if (pbVar5[1] != 0x5d) goto joined_r0x00177d2c;
      if (uVar9 < 3) break;
      if (pbVar5[2] == 0x3e) goto LAB_00177f91;
      goto joined_r0x00177d2c;
    case 5:
      if ((uVar9 != 1) &&
         (iVar6 = (*enc[3].literalScanners[0])(enc,(char *)pbVar5,pcVar16,ppcVar13), iVar6 == 0)) {
        pcVar16 = extraout_RDX_08;
        pbVar1 = pbVar5 + 2;
        goto joined_r0x00177d2c;
      }
      break;
    case 6:
      if ((2 < uVar9) &&
         (iVar6 = (*enc[3].literalScanners[1])(enc,(char *)pbVar5,pcVar16,ppcVar13), iVar6 == 0)) {
        pcVar16 = extraout_RDX_07;
        pbVar1 = pbVar5 + 3;
        goto joined_r0x00177d2c;
      }
      break;
    case 7:
      if ((3 < uVar9) &&
         (iVar6 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar5,pcVar16,(char *)ppcVar13),
         iVar6 == 0)) {
        pcVar16 = extraout_RDX_09;
        pbVar1 = pbVar5 + 4;
        goto joined_r0x00177d2c;
      }
    }
    *nextTokPtr = (char *)pbVar5;
    return 6;
  }
switchD_0017795f_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_00177f91:
  ppcVar13 = (char **)(pbVar5 + 2);
  goto switchD_00177ae5_caseD_8;
LAB_00178050:
  uVar15 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
  uVar14 = uVar15 - 5;
  if (uVar14 < 0x19) {
    pcVar16 = (char *)((long)&switchD_00178071::switchdataD_001bad54 +
                      (long)(int)(&switchD_00178071::switchdataD_001bad54)[uVar14]);
    switch(uVar15) {
    case 5:
      if (ppcVar10 == (char **)0x1) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar13,pcVar16,ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,extraout_RDX_19,ppcVar10);
      lVar11 = 3;
      break;
    case 6:
      if (ppcVar10 < (char **)0x3) {
        return -2;
      }
      iVar6 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar13,pcVar16,ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[2])(enc,(char *)ppcVar13,extraout_RDX_18,ppcVar10);
      lVar11 = 4;
      break;
    case 7:
      if (ppcVar10 < (char **)0x4) {
        return -2;
      }
      iVar6 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar13,pcVar16,(char *)ppcVar10);
      if (iVar6 != 0) goto switchD_00177ae5_caseD_8;
      iVar6 = (*enc[3].scanners[3])(enc,(char *)ppcVar13,extraout_RDX_20,ppcVar10);
      lVar11 = 5;
      break;
    default:
      goto switchD_00177ae5_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00178071_caseD_9;
    case 0xb:
      goto switchD_00177b34_caseD_b;
    case 0x11:
      goto switchD_00177b34_caseD_11;
    case 0x16:
    case 0x18:
      lVar11 = 2;
      goto LAB_00178280;
    }
    if (iVar6 != 0) {
LAB_00178280:
      iVar6 = normal_scanAtts(enc,(char *)((long)ppcVar13 + lVar11 + -1),end,nextTokPtr);
      return iVar6;
    }
  }
  goto switchD_00177ae5_caseD_8;
switchD_00178071_caseD_9:
  ppcVar13 = (char **)((long)ppcVar13 + 1);
  ppcVar10 = (char **)((long)ppcVar10 + -1);
  if ((long)ppcVar10 < 1) {
    return -1;
  }
  goto LAB_00178050;
switchD_00177b34_caseD_b:
  *nextTokPtr = (char *)((long)ppcVar13 + 1);
  return 2;
switchD_00177b34_caseD_11:
  pbVar1 = (byte *)((long)ppcVar13 + 1);
  if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
    return -1;
  }
  if (*pbVar1 != 0x3e) {
    *nextTokPtr = (char *)pbVar1;
    return 0;
  }
  *nextTokPtr = (char *)((long)ppcVar13 + 2);
  return 4;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}